

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_valddi.cpp
# Opt level: O0

ze_result_t zeGetModuleProcAddrTable(ze_api_version_t version,ze_module_dditable_t *pDdiTable)

{
  ze_api_version_t *pzVar1;
  ze_result_t result;
  ze_module_dditable_t *dditable;
  ze_module_dditable_t *pDdiTable_local;
  ze_api_version_t version_local;
  
  pzVar1 = validation_layer::context;
  if (pDdiTable == (ze_module_dditable_t *)0x0) {
    pDdiTable_local._4_4_ = ZE_RESULT_ERROR_INVALID_NULL_POINTER;
  }
  else if (((int)*validation_layer::context >> 0x10 == (int)version >> 0x10) &&
          ((*validation_layer::context & 0xffff) <= (version & 0xffff))) {
    *(ze_pfnModuleCreate_t *)(validation_layer::context + 0x140) = pDdiTable->pfnCreate;
    pDdiTable->pfnCreate = validation_layer::zeModuleCreate;
    *(ze_pfnModuleDestroy_t *)(pzVar1 + 0x142) = pDdiTable->pfnDestroy;
    pDdiTable->pfnDestroy = validation_layer::zeModuleDestroy;
    *(ze_pfnModuleDynamicLink_t *)(pzVar1 + 0x144) = pDdiTable->pfnDynamicLink;
    pDdiTable->pfnDynamicLink = validation_layer::zeModuleDynamicLink;
    *(ze_pfnModuleGetNativeBinary_t *)(pzVar1 + 0x146) = pDdiTable->pfnGetNativeBinary;
    pDdiTable->pfnGetNativeBinary = validation_layer::zeModuleGetNativeBinary;
    *(ze_pfnModuleGetGlobalPointer_t *)(pzVar1 + 0x148) = pDdiTable->pfnGetGlobalPointer;
    pDdiTable->pfnGetGlobalPointer = validation_layer::zeModuleGetGlobalPointer;
    *(ze_pfnModuleGetKernelNames_t *)(pzVar1 + 0x14a) = pDdiTable->pfnGetKernelNames;
    pDdiTable->pfnGetKernelNames = validation_layer::zeModuleGetKernelNames;
    *(ze_pfnModuleGetProperties_t *)(pzVar1 + 0x14c) = pDdiTable->pfnGetProperties;
    pDdiTable->pfnGetProperties = validation_layer::zeModuleGetProperties;
    *(ze_pfnModuleGetFunctionPointer_t *)(pzVar1 + 0x14e) = pDdiTable->pfnGetFunctionPointer;
    pDdiTable->pfnGetFunctionPointer = validation_layer::zeModuleGetFunctionPointer;
    *(ze_pfnModuleInspectLinkageExt_t *)(pzVar1 + 0x150) = pDdiTable->pfnInspectLinkageExt;
    pDdiTable->pfnInspectLinkageExt = validation_layer::zeModuleInspectLinkageExt;
    pDdiTable_local._4_4_ = ZE_RESULT_SUCCESS;
  }
  else {
    pDdiTable_local._4_4_ = ZE_RESULT_ERROR_UNSUPPORTED_VERSION;
  }
  return pDdiTable_local._4_4_;
}

Assistant:

ZE_DLLEXPORT ze_result_t ZE_APICALL
zeGetModuleProcAddrTable(
    ze_api_version_t version,                       ///< [in] API version requested
    ze_module_dditable_t* pDdiTable                 ///< [in,out] pointer to table of DDI function pointers
    )
{
    auto& dditable = validation_layer::context.zeDdiTable.Module;

    if( nullptr == pDdiTable )
        return ZE_RESULT_ERROR_INVALID_NULL_POINTER;

    if (ZE_MAJOR_VERSION(validation_layer::context.version) != ZE_MAJOR_VERSION(version) ||
        ZE_MINOR_VERSION(validation_layer::context.version) > ZE_MINOR_VERSION(version))
        return ZE_RESULT_ERROR_UNSUPPORTED_VERSION;

    ze_result_t result = ZE_RESULT_SUCCESS;

    dditable.pfnCreate                                   = pDdiTable->pfnCreate;
    pDdiTable->pfnCreate                                 = validation_layer::zeModuleCreate;

    dditable.pfnDestroy                                  = pDdiTable->pfnDestroy;
    pDdiTable->pfnDestroy                                = validation_layer::zeModuleDestroy;

    dditable.pfnDynamicLink                              = pDdiTable->pfnDynamicLink;
    pDdiTable->pfnDynamicLink                            = validation_layer::zeModuleDynamicLink;

    dditable.pfnGetNativeBinary                          = pDdiTable->pfnGetNativeBinary;
    pDdiTable->pfnGetNativeBinary                        = validation_layer::zeModuleGetNativeBinary;

    dditable.pfnGetGlobalPointer                         = pDdiTable->pfnGetGlobalPointer;
    pDdiTable->pfnGetGlobalPointer                       = validation_layer::zeModuleGetGlobalPointer;

    dditable.pfnGetKernelNames                           = pDdiTable->pfnGetKernelNames;
    pDdiTable->pfnGetKernelNames                         = validation_layer::zeModuleGetKernelNames;

    dditable.pfnGetProperties                            = pDdiTable->pfnGetProperties;
    pDdiTable->pfnGetProperties                          = validation_layer::zeModuleGetProperties;

    dditable.pfnGetFunctionPointer                       = pDdiTable->pfnGetFunctionPointer;
    pDdiTable->pfnGetFunctionPointer                     = validation_layer::zeModuleGetFunctionPointer;

    dditable.pfnInspectLinkageExt                        = pDdiTable->pfnInspectLinkageExt;
    pDdiTable->pfnInspectLinkageExt                      = validation_layer::zeModuleInspectLinkageExt;

    return result;
}